

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object __thiscall
pybind11::detail::accessor_policies::generic_item::get(generic_item *this,handle obj,handle key)

{
  PyObject **ppPVar1;
  PyObject *pPVar2;
  error_already_set *this_00;
  PyObject *result;
  handle key_local;
  handle obj_local;
  
  result = key.m_ptr;
  key_local = obj;
  ppPVar1 = handle::ptr(&key_local);
  pPVar2 = *ppPVar1;
  ppPVar1 = handle::ptr((handle *)&result);
  pPVar2 = (PyObject *)PyObject_GetItem(pPVar2,*ppPVar1);
  if (pPVar2 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  object::object((object *)this,pPVar2,false);
  return (object)(handle)this;
}

Assistant:

static object get(handle obj, handle key) {
        PyObject *result = PyObject_GetItem(obj.ptr(), key.ptr());
        if (!result) { throw error_already_set(); }
        return {result, false};
    }